

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string_view exec_name;
  string_view exec_name_00;
  string_view exec_name_01;
  int iVar1;
  char *pcVar2;
  bool is_interactive;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar3;
  string server_addr;
  string local_100;
  string db_command;
  UrsaClient client;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&server_addr,"tcp://localhost:9281",(allocator<char> *)&client);
  db_command._M_dataplus._M_p = (pointer)&db_command.field_2;
  db_command._M_string_length = 0;
  db_command.field_2._M_local_buf[0] = '\0';
  uVar3 = 0;
  iVar1 = isatty(0);
  is_interactive = iVar1 != 0;
  while( true ) {
    while( true ) {
      iVar1 = getopt(argc,argv,"hqjc:");
      if (iVar1 != 99) break;
      std::__cxx11::string::assign((char *)&db_command);
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x68) {
      if (argc < 1) {
        pcVar2 = "ursacli";
      }
      else {
        pcVar2 = *argv;
      }
      strlen(pcVar2);
      iVar1 = 0;
      exec_name._M_str._0_4_ = in_stack_fffffffffffffed8;
      exec_name._M_len = 0x11e194;
      exec_name._M_str._4_4_ = uVar3;
      print_usage(exec_name);
      goto LAB_0011e259;
    }
    if (iVar1 == 0x6a) {
      uVar3 = 1;
    }
    else {
      if (iVar1 != 0x71) {
        if (argc < 1) {
          pcVar2 = "ursacli";
        }
        else {
          pcVar2 = *argv;
        }
        strlen(pcVar2);
        exec_name_00._M_str._0_4_ = in_stack_fffffffffffffed8;
        exec_name_00._M_len = 0x11e1b3;
        exec_name_00._M_str._4_4_ = uVar3;
        print_usage(exec_name_00);
        spdlog::error<char[30]>((char (*) [30])"Failed to parse command line.");
LAB_0011e23e:
        iVar1 = 1;
LAB_0011e259:
        std::__cxx11::string::~string((string *)&db_command);
        std::__cxx11::string::~string((string *)&server_addr);
        return iVar1;
      }
      is_interactive = false;
    }
  }
  if (1 < argc - _optind) {
    spdlog::error<char[40]>((char (*) [40])"Too many positional arguments provided.");
    if (argc < 1) {
      pcVar2 = "ursacli";
    }
    else {
      pcVar2 = *argv;
    }
    strlen(pcVar2);
    exec_name_01._M_str._0_4_ = in_stack_fffffffffffffed8;
    exec_name_01._M_len = 0x11e23e;
    exec_name_01._M_str._4_4_ = uVar3;
    print_usage(exec_name_01);
    goto LAB_0011e23e;
  }
  if (argc - _optind == 1) {
    std::__cxx11::string::assign((char *)&server_addr);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)server_addr._M_dataplus._M_p == &server_addr.field_2) {
    local_100.field_2._8_8_ = server_addr.field_2._8_8_;
  }
  else {
    local_100._M_dataplus._M_p = server_addr._M_dataplus._M_p;
  }
  local_100._M_string_length = server_addr._M_string_length;
  server_addr._M_string_length = 0;
  server_addr.field_2._M_local_buf[0] = '\0';
  server_addr._M_dataplus._M_p = (pointer)&server_addr.field_2;
  UrsaClient::UrsaClient(&client,&local_100,is_interactive,(bool)((byte)uVar3 & 1));
  std::__cxx11::string::~string((string *)&local_100);
  if (db_command._M_string_length == 0) {
    UrsaClient::start(&client);
  }
  else {
    UrsaClient::one_shot_command(&client,&db_command);
  }
  UrsaClient::~UrsaClient(&client);
  iVar1 = 0;
  goto LAB_0011e259;
}

Assistant:

int main(int argc, char *argv[]) {
    std::string server_addr = "tcp://localhost:9281";
    std::string db_command;
    bool is_interactive = isatty(STDIN_FILENO) != 0;
    bool raw_json = false;

    int c;

    while ((c = getopt(argc, argv, "hqjc:")) != -1) {
        switch (c) {
            case 'q':
                is_interactive = false;
                break;
            case 'c':
                db_command = optarg;
                break;
            case 'j':
                raw_json = true;
                break;
            case 'h':
                print_usage(argc >= 1 ? argv[0] : "ursacli");
                return 0;
            default:
                print_usage(argc >= 1 ? argv[0] : "ursacli");
                spdlog::error("Failed to parse command line.");
                return 1;
        }
    }

    if (argc - optind > 1) {
        spdlog::error("Too many positional arguments provided.");
        print_usage(argc >= 1 ? argv[0] : "ursacli");
        return 1;
    }
    if (argc - optind == 1) {
        server_addr = argv[optind];
    }

    try {
        UrsaClient client(std::move(server_addr), is_interactive, raw_json);
        if (!db_command.empty()) {
            client.one_shot_command(db_command);
        } else {
            client.start();
        }
    } catch (const std::runtime_error &ex) {
        spdlog::error("Runtime error: {}", ex.what());
        return 1;
    } catch (const zmq::error_t &ex) {
        spdlog::error("ZeroMQ error: {}", ex.what());
        return 1;
    }
}